

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

FARPROC GetProcAddress(HMODULE hModule,LPCSTR lpProcName)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  long *plVar4;
  BOOL BVar5;
  errno_t eVar6;
  FARPROC ProcAddress;
  char *lpMultiByteStr;
  LPWSTR pWVar7;
  size_t sVar8;
  long *_Dst;
  DWORD dwErrCode;
  size_t _SizeInBytes;
  long in_FS_OFFSET;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Dst = &local_38;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001ce010;
  uStack_40 = 0x1cde3c;
  LockModuleList();
  if ((lpProcName == (LPCSTR)0x0) || (*lpProcName == '\0')) {
    dwErrCode = 0x57;
LAB_001cdf2f:
    _Dst = &local_38;
    plVar4 = &local_38;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001ce010;
LAB_001cdf3a:
    _Dst = plVar4;
    *(undefined8 *)((long)_Dst + -8) = 0x1cdf3f;
    SetLastError(dwErrCode);
    ProcAddress = (FARPROC)0x0;
  }
  else {
    uStack_40 = 0x1cde57;
    BVar5 = LOADValidateModule((MODSTRUCT *)hModule);
    if (BVar5 == 0) {
      dwErrCode = 6;
      goto LAB_001cdf2f;
    }
    if (lpProcName < (LPCSTR)0x1000) {
      uStack_40 = 0x1cde94;
      fprintf(_stderr,"] %s %s:%d","GetProcAddress",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
              ,0x136);
      uStack_40 = 0x1cdea5;
      fprintf(_stderr,"Attempt to locate symbol by ordinal?!\n");
    }
    if ((pal_module == (MODSTRUCT *)0x0) || (*(void **)((long)hModule + 8) != pal_module->dl_handle)
       ) {
      ProcAddress = (FARPROC)0x0;
      _Dst = &local_38;
LAB_001cdec5:
      if (ProcAddress == (FARPROC)0x0) {
        uVar1 = *(undefined8 *)((long)hModule + 8);
        *(char *)((long)_Dst + -8) = -0x2a;
        *(char *)((long)_Dst + -7) = -0x22;
        *(char *)((long)_Dst + -6) = '\x1c';
        *(char *)((long)_Dst + -5) = '\0';
        *(char *)((long)_Dst + -4) = '\0';
        *(char *)((long)_Dst + -3) = '\0';
        *(char *)((long)_Dst + -2) = '\0';
        *(char *)((long)_Dst + -1) = '\0';
        ProcAddress = (FARPROC)dlsym(uVar1,lpProcName);
      }
      if (ProcAddress != (FARPROC)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001ce010;
        if ((*(long *)((long)hModule + 0x18) == 0) && (*(long *)((long)hModule + 8) != 0)) {
          *(char *)((long)_Dst + -8) = '\x04';
          *(char *)((long)_Dst + -7) = -0x21;
          *(char *)((long)_Dst + -6) = '\x1c';
          *(char *)((long)_Dst + -5) = '\0';
          *(char *)((long)_Dst + -4) = '\0';
          *(char *)((long)_Dst + -3) = '\0';
          *(char *)((long)_Dst + -2) = '\0';
          *(char *)((long)_Dst + -1) = '\0';
          lpMultiByteStr = PAL_dladdr(ProcAddress);
          if (lpMultiByteStr != (char *)0x0) {
            *(char *)((long)_Dst + -8) = '\x16';
            *(char *)((long)_Dst + -7) = -0x21;
            *(char *)((long)_Dst + -6) = '\x1c';
            *(char *)((long)_Dst + -5) = '\0';
            *(char *)((long)_Dst + -4) = '\0';
            *(char *)((long)_Dst + -3) = '\0';
            *(char *)((long)_Dst + -2) = '\0';
            *(char *)((long)_Dst + -1) = '\0';
            pWVar7 = UTIL_MBToWC_Alloc(lpMultiByteStr,-1);
            *(LPWSTR *)((long)hModule + 0x18) = pWVar7;
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_001ce010;
          }
        }
        goto LAB_001cdf42;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001ce010;
      *(char *)((long)_Dst + -8) = -0x75;
      *(char *)((long)_Dst + -7) = -0x21;
      *(char *)((long)_Dst + -6) = '\x1c';
      *(char *)((long)_Dst + -5) = '\0';
      *(char *)((long)_Dst + -4) = '\0';
      *(char *)((long)_Dst + -3) = '\0';
      *(char *)((long)_Dst + -2) = '\0';
      *(char *)((long)_Dst + -1) = '\0';
      dlerror();
      dwErrCode = 0x7f;
      plVar4 = _Dst;
      goto LAB_001cdf3a;
    }
    uStack_40 = 0x1cdf9a;
    sVar8 = strlen(lpProcName);
    _SizeInBytes = (size_t)((int)sVar8 + 5);
    lVar2 = -(_SizeInBytes + 0xf & 0xfffffffffffffff0);
    _Dst = (long *)((long)&local_38 + lVar2);
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1cdfc4;
    eVar6 = strcpy_s((char *)_Dst,_SizeInBytes,"PAL_");
    if (eVar6 == 0) {
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1cdfd6;
      eVar6 = strcat_s((char *)_Dst,_SizeInBytes,lpProcName);
      if (eVar6 != 0) goto LAB_001cdfda;
      uVar1 = *(undefined8 *)((long)hModule + 8);
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1ce009;
      ProcAddress = (FARPROC)dlsym(uVar1,_Dst);
      bVar3 = true;
    }
    else {
LAB_001cdfda:
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001ce010;
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1cdfeb;
      SetLastError(0x7a);
      ProcAddress = (FARPROC)0x0;
      bVar3 = false;
    }
    if (bVar3) goto LAB_001cdec5;
  }
LAB_001cdf42:
  *(char *)((long)_Dst + -8) = 'G';
  *(char *)((long)_Dst + -7) = -0x21;
  *(char *)((long)_Dst + -6) = '\x1c';
  *(char *)((long)_Dst + -5) = '\0';
  *(char *)((long)_Dst + -4) = '\0';
  *(char *)((long)_Dst + -3) = '\0';
  *(char *)((long)_Dst + -2) = '\0';
  *(char *)((long)_Dst + -1) = '\0';
  UnlockModuleList();
  if (PAL_InitializeChakraCoreCalled != false) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      *(code **)((long)_Dst + -8) = LockModuleList;
      __stack_chk_fail();
    }
    return ProcAddress;
  }
LAB_001ce010:
  *(char *)((long)_Dst + -8) = '\x15';
  *(char *)((long)_Dst + -7) = -0x20;
  *(char *)((long)_Dst + -6) = '\x1c';
  *(char *)((long)_Dst + -5) = '\0';
  *(char *)((long)_Dst + -4) = '\0';
  *(char *)((long)_Dst + -3) = '\0';
  *(char *)((long)_Dst + -2) = '\0';
  *(char *)((long)_Dst + -1) = '\0';
  abort();
}

Assistant:

FARPROC
PALAPI
GetProcAddress(
    IN HMODULE hModule,
    IN LPCSTR lpProcName)
{
    MODSTRUCT *module;
    FARPROC ProcAddress = nullptr;
    LPCSTR symbolName = lpProcName;

    PERF_ENTRY(GetProcAddress);
    ENTRY("GetProcAddress (hModule=%p, lpProcName=%p (%s))\n",
          hModule, lpProcName ? lpProcName : "NULL", lpProcName ? lpProcName : "NULL");

    LockModuleList();

    module = (MODSTRUCT *) hModule;

    /* parameter validation */

    if ((lpProcName == nullptr) || (*lpProcName == '\0'))
    {
        TRACE("No function name given\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (!LOADValidateModule(module))
    {
        TRACE("Invalid module handle %p\n", hModule);
        SetLastError(ERROR_INVALID_HANDLE);
        goto done;
    }

    /* try to assert on attempt to locate symbol by ordinal */
    /* this can't be an exact test for HIWORD((DWORD)lpProcName) == 0
       because of the address range reserved for ordinals contain can
       be a valid string address on non-Windows systems
    */
    if ((DWORD_PTR)lpProcName < VIRTUAL_PAGE_SIZE)
    {
        ASSERT("Attempt to locate symbol by ordinal?!\n");
    }

    // Get the symbol's address.

    // If we're looking for a symbol inside the PAL, we try the PAL_ variant
    // first because otherwise we run the risk of having the non-PAL_
    // variant preferred over the PAL's implementation.
    if (pal_module && module->dl_handle == pal_module->dl_handle)
    {
        int iLen = 4 + strlen(lpProcName) + 1;
        LPSTR lpPALProcName = (LPSTR) alloca(iLen);

        if (strcpy_s(lpPALProcName, iLen, "PAL_") != SAFECRT_SUCCESS)
        {
            ERROR("strcpy_s failed!\n");
            SetLastError(ERROR_INSUFFICIENT_BUFFER);
            goto done;
        }

        if (strcat_s(lpPALProcName, iLen, lpProcName) != SAFECRT_SUCCESS)
        {
            ERROR("strcat_s failed!\n");
            SetLastError(ERROR_INSUFFICIENT_BUFFER);
            goto done;
        }

        ProcAddress = (FARPROC) dlsym(module->dl_handle, lpPALProcName);
        symbolName = lpPALProcName;
    }

    // If we aren't looking inside the PAL or we didn't find a PAL_ variant
    // inside the PAL, fall back to a normal search.
    if (ProcAddress == nullptr)
    {
        ProcAddress = (FARPROC) dlsym(module->dl_handle, lpProcName);
    }

    if (ProcAddress)
    {
        TRACE("Symbol %s found at address %p in module %p (named %S)\n",
              lpProcName, ProcAddress, module, MODNAME(module));

        /* if we don't know the module's full name yet, this is our chance to obtain it */
        if (!module->lib_name && module->dl_handle)
        {
            const char* libName = PAL_dladdr((LPVOID)ProcAddress);
            if (libName)
            {
                module->lib_name = UTIL_MBToWC_Alloc(libName, -1);
                if (nullptr == module->lib_name)
                {
                    ERROR("MBToWC failure; can't save module's full name\n");
                }
                else
                {
                    TRACE("Saving full path of module %p as %s\n",
                          module, libName);
                }
            }
        }
    }
    else
    {
        TRACE("Symbol %s not found in module %p (named %S), dlerror message is \"%s\"\n",
              lpProcName, module, MODNAME(module), dlerror());
        SetLastError(ERROR_PROC_NOT_FOUND);
    }
done:
    UnlockModuleList();
    LOGEXIT("GetProcAddress returns FARPROC %p\n", ProcAddress);
    PERF_EXIT(GetProcAddress);
    return ProcAddress;
}